

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

string * __thiscall
Session::receive(string *__return_storage_ptr__,Session *this,string *message_name,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments)

{
  string *str;
  pointer pcVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  undefined1 *local_e0;
  size_t local_d8;
  undefined1 local_d0 [16];
  string local_c0;
  StringInstance local_a0;
  
  iVar4 = std::__cxx11::string::compare((char *)message_name);
  if (iVar4 == 0) {
    this->_is_connected = false;
LAB_0014e204:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    return __return_storage_ptr__;
  }
  iVar4 = std::__cxx11::string::compare((char *)message_name);
  if (iVar4 == 0) {
    str = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
      bVar3 = Grammar::is_string_value(str);
      if (bVar3) {
        StringInstance::StringInstance
                  (&local_a0,
                   (arguments->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        StringInstance::value_abi_cxx11_(&local_c0,&local_a0);
        pcVar1 = (Server::_instance->_password)._M_dataplus._M_p;
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar1,
                   pcVar1 + (Server::_instance->_password)._M_string_length);
        puVar2 = local_e0;
        if (local_c0._M_string_length == local_d8) {
          if (local_c0._M_string_length == 0) {
            bVar3 = true;
          }
          else {
            iVar4 = bcmp(local_c0._M_dataplus._M_p,local_e0,local_c0._M_string_length);
            bVar3 = iVar4 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (puVar2 != local_d0) {
          operator_delete(puVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        StringInstance::~StringInstance(&local_a0);
        if (bVar3) {
          this->_is_authenticated = true;
          goto LAB_0014e204;
        }
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar6 = "AuthenticationError: wrong password.";
      }
      else {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar6 = "RuntimeError: invalid argument.";
      }
    }
    else {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar6 = "RuntimeError: wrong number of arguments.";
    }
  }
  else {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar6 = "RuntimeError: invalid message.";
  }
  *puVar5 = pcVar6;
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::string Session::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "close") {
        _is_connected = false;
        return "null";
    }
    if (message_name == "authenticateWithPassword:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_string_value(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        if (StringInstance(arguments[0]).value() == Server::get_instance()->get_password()) {
            _is_authenticated = true;
            return "null";
        }
        throw EXC_WRONG_PASSWORD;
    }
    throw EXC_INVALID_MESSAGE;
}